

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O1

shared_ptr<Storage::Disk::Track>
GTrackWithSectors<MFMEncoder>
          (vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
           *sectors,size_t post_index_address_mark_bytes,uint8_t post_index_address_mark_value,
          size_t pre_address_mark_bytes,size_t post_address_mark_bytes,
          uint8_t post_address_mark_value,size_t pre_data_mark_bytes,size_t post_data_bytes,
          uint8_t post_data_value,size_t expected_track_bytes)

{
  uint8_t *puVar1;
  ushort uVar2;
  bool bVar3;
  undefined8 *puVar4;
  uint uVar5;
  ulong uVar6;
  unsigned_short uVar7;
  int c;
  long lVar8;
  long *plVar9;
  uint uVar10;
  byte fuzzy_mask;
  int iVar11;
  undefined7 in_register_00000011;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  ushort uVar13;
  vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
  *__range1;
  uint8_t input;
  byte bVar14;
  undefined7 in_register_00000089;
  ulong uVar15;
  ulong uVar16;
  undefined8 *puVar17;
  shared_ptr<Storage::Disk::Track> sVar18;
  undefined7 in_stack_00000019;
  ulong in_stack_00000028;
  PCMSegment segment;
  MFMEncoder shifter;
  undefined1 local_311;
  ulong local_310;
  ulong local_308;
  ulong local_300;
  uint local_2f4;
  vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
  *local_2f0;
  size_type local_2e8;
  ulong local_2e0;
  PCMTrack *local_2d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2d0;
  PCMSegment local_2c8;
  undefined8 *local_270;
  ulong local_268;
  undefined8 *local_260;
  MFMEncoder local_258;
  
  uVar15 = CONCAT71(in_register_00000089,post_address_mark_value);
  uVar16 = CONCAT71(in_register_00000011,post_index_address_mark_value);
  local_2c8.length_of_a_bit.length = 1;
  local_2c8.length_of_a_bit.clock_rate = 1;
  local_2c8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_2c8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  local_2c8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_2c8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  local_2c8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_2c8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  local_2c8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_2c8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_2c8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_2c8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  local_2e8 = in_stack_00000028 * 8;
  local_2f0 = sectors;
  std::vector<bool,_std::allocator<bool>_>::reserve(&local_2c8.data,local_2e8);
  local_300 = CONCAT71(in_stack_00000019,post_data_value);
  local_310 = post_data_bytes;
  local_258.super_Encoder.crc_generator_.
  super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>.value_ =
       0xffff;
  lVar8 = 0;
  do {
    uVar10 = (int)lVar8 << 8;
    iVar11 = 8;
    do {
      uVar10 = uVar10 * 2 ^ (uint)(int)(short)uVar10 >> 0xf & 0x1021;
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
    local_258.super_Encoder.crc_generator_.
    super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>.
    xor_table[lVar8] = (unsigned_short)uVar10;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x100);
  local_258.super_Encoder.target_ = &local_2c8.data;
  local_258.super_Encoder.fuzzy_target_ = (vector<bool,_std::allocator<bool>_> *)0x0;
  local_258.super_Encoder._vptr_Encoder = (_func_int **)&PTR__Encoder_005aac58;
  lVar8 = 0;
  for (plVar9 = *(long **)post_index_address_mark_bytes;
      plVar9 != *(long **)(post_index_address_mark_bytes + 8); plVar9 = plVar9 + 1) {
    lVar8 = lVar8 + (int)(0x80 << (*(byte *)(*plVar9 + 3) & 0x1f) | 2);
  }
  local_308 = (in_stack_00000028 / 10 + in_stack_00000028) * 8;
  do {
    if ((((uVar15 + post_address_mark_bytes + local_300 + local_310) * 2 + 0x1c) *
         ((ulong)((long)*(long **)(post_index_address_mark_bytes + 8) -
                 (long)*(long **)post_index_address_mark_bytes) >> 3) + (uVar16 + lVar8) * 2) * 8 +
        0x40 < local_308) {
      bVar3 = false;
    }
    else if (((uVar15 == 0 && post_address_mark_bytes == 0) && (local_310 == 0 && local_300 == 0))
             && uVar16 == 0) {
      local_310 = 0;
      bVar3 = false;
      uVar15 = 0;
      post_address_mark_bytes = 0;
      uVar16 = 0;
    }
    else {
      uVar16 = uVar16 >> 1;
      post_address_mark_bytes = post_address_mark_bytes >> 1;
      uVar15 = uVar15 >> 1;
      local_310 = local_310 >> 1;
      local_300 = local_300 >> 1;
      bVar3 = true;
    }
  } while (bVar3);
  MFMEncoder::add_index_address_mark(&local_258);
  if (uVar16 != 0) {
    do {
      MFMEncoder::add_byte(&local_258,(uint8_t)pre_address_mark_bytes,'\0');
      uVar16 = uVar16 - 1;
    } while (uVar16 != 0);
  }
  puVar17 = *(undefined8 **)post_index_address_mark_bytes;
  local_270 = *(undefined8 **)(post_index_address_mark_bytes + 8);
  local_268 = uVar15;
  if (puVar17 != local_270) {
    local_2f4 = (uint)(byte)expected_track_bytes;
    local_2e0 = post_address_mark_bytes;
    do {
      puVar1 = (uint8_t *)*puVar17;
      local_260 = puVar17;
      if (post_address_mark_bytes != 0) {
        uVar16 = 0;
        do {
          local_258.super_Encoder.crc_generator_.
          super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>.
          value_ = local_258.super_Encoder.crc_generator_.
                   super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                   .value_ << 8 ^
                   local_258.super_Encoder.crc_generator_.
                   super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                   .xor_table
                   [local_258.super_Encoder.crc_generator_.
                    super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                    .value_ >> 8];
          uVar2 = (ushort)(local_258._544_4_ << 0xf);
          local_258._544_4_ = CONCAT22(local_258._546_2_,uVar2) ^ 0xaaaa;
          uVar10 = 0x8000;
          do {
            uVar13 = (ushort)uVar10;
            std::vector<bool,_std::allocator<bool>_>::push_back
                      (local_258.super_Encoder.target_,(uVar13 & (uVar2 ^ 0xaaaa)) != 0);
            uVar10 = uVar10 >> 1;
          } while (1 < uVar13);
          uVar16 = uVar16 + 1;
        } while (uVar16 != local_2e0);
      }
      MFMEncoder::add_ID_address_mark(&local_258);
      uVar16 = local_268;
      uVar15 = local_310;
      MFMEncoder::add_byte(&local_258,*puVar1,'\0');
      MFMEncoder::add_byte(&local_258,puVar1[1],'\0');
      MFMEncoder::add_byte(&local_258,puVar1[2],'\0');
      MFMEncoder::add_byte(&local_258,puVar1[3],'\0');
      uVar7 = local_258.super_Encoder.crc_generator_.
              super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
              .value_;
      bVar14 = puVar1[0x21];
      (*local_258.super_Encoder._vptr_Encoder[3])
                (&local_258,
                 (ulong)(local_258.super_Encoder.crc_generator_.
                         super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                         .value_ >> 8),0);
      (*local_258.super_Encoder._vptr_Encoder[3])(&local_258,(ulong)(byte)(bVar14 ^ (byte)uVar7),0);
      for (; uVar16 != 0; uVar16 = uVar16 - 1) {
        MFMEncoder::add_byte(&local_258,(uint8_t)pre_data_mark_bytes,'\0');
      }
      if (uVar15 != 0) {
        uVar16 = 0;
        do {
          local_258.super_Encoder.crc_generator_.
          super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>.
          value_ = local_258.super_Encoder.crc_generator_.
                   super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                   .value_ << 8 ^
                   local_258.super_Encoder.crc_generator_.
                   super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                   .xor_table
                   [local_258.super_Encoder.crc_generator_.
                    super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                    .value_ >> 8];
          uVar2 = (ushort)(local_258._544_4_ << 0xf);
          local_258._544_4_ = CONCAT22(local_258._546_2_,uVar2) ^ 0xaaaa;
          uVar10 = 0x8000;
          do {
            uVar13 = (ushort)uVar10;
            std::vector<bool,_std::allocator<bool>_>::push_back
                      (local_258.super_Encoder.target_,(uVar13 & (uVar2 ^ 0xaaaa)) != 0);
            uVar10 = uVar10 >> 1;
          } while (1 < uVar13);
          uVar16 = uVar16 + 1;
        } while (uVar16 != local_310);
      }
      uVar16 = local_300;
      uVar10 = local_2f4;
      uVar15 = local_2e0;
      puVar4 = local_260;
      if (*(long *)(puVar1 + 8) != *(long *)(puVar1 + 0x10)) {
        if (puVar1[0x22] == '\x01') {
          MFMEncoder::add_deleted_data_address_mark(&local_258);
        }
        else {
          MFMEncoder::add_data_address_mark(&local_258);
        }
        bVar14 = puVar1[3];
        uVar16 = (ulong)(0x80 << (bVar14 & 0x1f));
        plVar9 = *(long **)(puVar1 + 8);
        lVar8 = *plVar9;
        if ((ulong)((*(long *)(puVar1 + 0x10) - (long)plVar9 >> 3) * -0x5555555555555555) < 2) {
          if (0x18 < bVar14 || plVar9[1] == lVar8) goto LAB_00445380;
          uVar15 = 0;
          do {
            MFMEncoder::add_byte(&local_258,*(uint8_t *)(lVar8 + uVar15),'\0');
            uVar15 = uVar15 + 1;
            lVar8 = **(long **)(puVar1 + 8);
            if ((ulong)((*(long **)(puVar1 + 8))[1] - lVar8) <= uVar15) break;
          } while (uVar15 < uVar16);
        }
        else if (0x18 < bVar14 || plVar9[1] == lVar8) {
LAB_00445380:
          uVar15 = 0;
        }
        else {
          uVar15 = 0;
          do {
            fuzzy_mask = 0;
            bVar14 = *(byte *)(lVar8 + uVar15);
            while (plVar9 = plVar9 + 3, plVar9 != *(long **)(puVar1 + 0x10)) {
              fuzzy_mask = fuzzy_mask | *(byte *)(*plVar9 + uVar15) ^ bVar14;
              bVar14 = bVar14 & ~fuzzy_mask;
            }
            MFMEncoder::add_byte(&local_258,*(byte *)(lVar8 + uVar15),fuzzy_mask);
            uVar15 = uVar15 + 1;
            plVar9 = *(long **)(puVar1 + 8);
            lVar8 = *plVar9;
          } while ((uVar15 < (ulong)(plVar9[1] - lVar8)) && (uVar15 < uVar16));
        }
        if (uVar15 < uVar16) {
          do {
            local_258.super_Encoder.crc_generator_.
            super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>.
            value_ = local_258.super_Encoder.crc_generator_.
                     super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                     .value_ << 8 ^
                     local_258.super_Encoder.crc_generator_.
                     super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                     .xor_table
                     [local_258.super_Encoder.crc_generator_.
                      super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                      .value_ >> 8];
            uVar2 = (ushort)(local_258._544_4_ << 0xf);
            local_258._544_4_ = CONCAT22(local_258._546_2_,uVar2) ^ 0xaaaa;
            uVar10 = 0x8000;
            do {
              uVar13 = (ushort)uVar10;
              std::vector<bool,_std::allocator<bool>_>::push_back
                        (local_258.super_Encoder.target_,(uVar13 & (uVar2 ^ 0xaaaa)) != 0);
              uVar10 = uVar10 >> 1;
            } while (1 < uVar13);
            uVar15 = uVar15 + 1;
          } while (uVar15 != uVar16);
        }
        uVar7 = local_258.super_Encoder.crc_generator_.
                super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                .value_;
        bVar14 = puVar1[0x20];
        (*local_258.super_Encoder._vptr_Encoder[3])
                  (&local_258,
                   (ulong)(local_258.super_Encoder.crc_generator_.
                           super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                           .value_ >> 8),0);
        (*local_258.super_Encoder._vptr_Encoder[3])
                  (&local_258,(ulong)(byte)(bVar14 ^ (byte)uVar7),0);
        uVar16 = local_300;
        uVar10 = local_2f4;
        uVar15 = local_2e0;
        puVar4 = local_260;
      }
      for (; puVar17 = local_260, uVar6 = local_2e0, uVar5 = local_2f4, uVar16 != 0;
          uVar16 = uVar16 - 1) {
        input = (uint8_t)local_2f4;
        local_2f4 = uVar10;
        local_2e0 = uVar15;
        local_260 = puVar4;
        MFMEncoder::add_byte(&local_258,input,'\0');
        uVar10 = local_2f4;
        uVar15 = local_2e0;
        puVar4 = local_260;
        local_260 = puVar17;
        local_2e0 = uVar6;
        local_2f4 = uVar5;
      }
      puVar17 = local_260 + 1;
      post_address_mark_bytes = local_2e0;
      local_2f4 = uVar10;
      local_2e0 = uVar15;
      local_260 = puVar4;
    } while (puVar17 != local_270);
  }
  while (uVar16 = (ulong)local_2c8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                  ((long)local_2c8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                  (long)local_2c8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8,
        uVar16 < local_2e8) {
    local_258.super_Encoder.crc_generator_.
    super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>.value_ =
         local_258.super_Encoder.crc_generator_.
         super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>.
         value_ << 8 ^
         local_258.super_Encoder.crc_generator_.
         super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>.
         xor_table[local_258.super_Encoder.crc_generator_.
                   super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                   .value_ >> 8];
    uVar2 = (ushort)(local_258._544_4_ << 0xf);
    local_258._544_4_ = CONCAT22(local_258._546_2_,uVar2) ^ 0xaaaa;
    uVar10 = 0x8000;
    do {
      uVar13 = (ushort)uVar10;
      std::vector<bool,_std::allocator<bool>_>::push_back
                (local_258.super_Encoder.target_,(uVar13 & (uVar2 ^ 0xaaaa)) != 0);
      uVar10 = uVar10 >> 1;
    } while (1 < uVar13);
  }
  if (local_308 < uVar16) {
    std::vector<bool,_std::allocator<bool>_>::resize(&local_2c8.data,local_308,false);
  }
  local_2d8 = (PCMTrack *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Storage::Disk::PCMTrack,std::allocator<Storage::Disk::PCMTrack>,Storage::Disk::PCMSegment>
            (&local_2d0,&local_2d8,(allocator<Storage::Disk::PCMTrack> *)&local_311,&local_2c8);
  _Var12._M_pi = local_2d0._M_pi;
  (local_2f0->
  super__Vector_base<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)local_2d8;
  (local_2f0->
  super__Vector_base<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (local_2f0->
  super__Vector_base<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)_Var12._M_pi;
  _Var12._M_pi = extraout_RDX;
  if (local_2c8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_2c8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_2c8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_2c8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_2c8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_2c8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_offset = 0;
    local_2c8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_2c8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_2c8.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_end_of_storage = (_Bit_pointer)0x0;
    _Var12._M_pi = extraout_RDX_00;
  }
  if (local_2c8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_2c8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_2c8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_2c8.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    _Var12._M_pi = extraout_RDX_01;
  }
  sVar18.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var12._M_pi;
  sVar18.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_2f0;
  return (shared_ptr<Storage::Disk::Track>)
         sVar18.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Storage::Disk::Track>
		GTrackWithSectors(
			const std::vector<const Sector *> &sectors,
			std::size_t post_index_address_mark_bytes, uint8_t post_index_address_mark_value,
			std::size_t pre_address_mark_bytes,
			std::size_t post_address_mark_bytes, uint8_t post_address_mark_value,
			std::size_t pre_data_mark_bytes,
			std::size_t post_data_bytes, uint8_t post_data_value,
			std::size_t expected_track_bytes) {
	Storage::Disk::PCMSegment segment;
	segment.data.reserve(expected_track_bytes * 8);
	T shifter(segment.data);

	// Make a pre-estimate of output size, in case any of the idealised gaps
	// provided need to be shortened.
	const size_t data_size = shifter.item_size(SurfaceItem::Data);
	const size_t mark_size = shifter.item_size(SurfaceItem::Mark);
	const size_t max_size = (expected_track_bytes + (expected_track_bytes / 10)) * 8;

	size_t total_sector_bytes = 0;
	for(const auto sector : sectors) {
		total_sector_bytes += size_t(128 << sector->size) + 2;
	}

	// Seek appropriate gap sizes, if the defaults don't allow all data to fit.
	while(true) {
		const size_t size =
			mark_size +
			post_index_address_mark_bytes * data_size +
			total_sector_bytes * data_size +
			sectors.size() * (
				(pre_address_mark_bytes + 6 + post_address_mark_bytes + pre_data_mark_bytes + post_data_bytes) * data_size + 2 * mark_size
			);

		// If this track already fits, do nothing.
		if(size*8 < max_size) break;

		// If all gaps are already zero, do nothing.
		if(!post_index_address_mark_bytes && !pre_address_mark_bytes && !post_address_mark_bytes && !pre_data_mark_bytes && !post_data_bytes)
			break;

		// Very simple solution: try halving all gaps.
		post_index_address_mark_bytes >>= 1;
		pre_address_mark_bytes >>= 1;
		post_address_mark_bytes >>= 1;
		pre_data_mark_bytes >>= 1;
		post_data_bytes >>= 1;
	}

	// Output the index mark.
	shifter.add_index_address_mark();

	// Add the post-index mark.
	for(std::size_t c = 0; c < post_index_address_mark_bytes; c++) shifter.add_byte(post_index_address_mark_value);

	// Add sectors.
	for(const Sector *sector : sectors) {
		// Gap.
		for(std::size_t c = 0; c < pre_address_mark_bytes; c++) shifter.add_byte(0x00);

		// Sector header.
		shifter.add_ID_address_mark();
		shifter.add_byte(sector->address.track);
		shifter.add_byte(sector->address.side);
		shifter.add_byte(sector->address.sector);
		shifter.add_byte(sector->size);
		shifter.add_crc(sector->has_header_crc_error);

		// Gap.
		for(std::size_t c = 0; c < post_address_mark_bytes; c++) shifter.add_byte(post_address_mark_value);
		for(std::size_t c = 0; c < pre_data_mark_bytes; c++) shifter.add_byte(0x00);

		// Data, if attached.
		if(!sector->samples.empty()) {
			if(sector->is_deleted)
				shifter.add_deleted_data_address_mark();
			else
				shifter.add_data_address_mark();

			std::size_t c = 0;
			std::size_t declared_length = size_t(128 << sector->size);
			if(sector->samples.size() > 1) {
				// For each byte, mark as fuzzy any bits that differ. Which isn't exactly the
				// same thing as obeying the multiple samples, as it discards the implied
				// probabilities of different values.
				for(c = 0; c < sector->samples[0].size() && c < declared_length; c++) {
					auto sample_iterator = sector->samples.begin();
					uint8_t value = (*sample_iterator)[c], fuzzy_mask = 0;

					++sample_iterator;
					while(sample_iterator != sector->samples.end()) {
						// Mark as fuzzy any bits that differ here from the
						// canonical value, and zero them out in the original.
						// That might cause them to retrigger, but who cares?
						fuzzy_mask |= value ^ (*sample_iterator)[c];
						value &= ~fuzzy_mask;

						++sample_iterator;
					}
					shifter.add_byte(sector->samples[0][c], fuzzy_mask);
				}
			} else {
				for(c = 0; c < sector->samples[0].size() && c < declared_length; c++) {
					shifter.add_byte(sector->samples[0][c]);
				}
			}
			for(; c < declared_length; c++) {
				shifter.add_byte(0x00);
			}
			shifter.add_crc(sector->has_data_crc_error);
		}

		// Gap.
		for(std::size_t c = 0; c < post_data_bytes; c++) shifter.add_byte(post_data_value);
	}

	while(segment.data.size() < expected_track_bytes*8) shifter.add_byte(0x00);

	// Allow the amount of data written to be up to 10% more than the expected size. Which is generous.
	if(segment.data.size() > max_size) segment.data.resize(max_size);

	return std::make_shared<Storage::Disk::PCMTrack>(std::move(segment));
}